

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitDefinedFunction(PrintSExpression *this,Function *curr)

{
  HeapType *this_00;
  ostream *poVar1;
  char *pcVar2;
  Function *pFVar3;
  StackIR *ir;
  Expression *pEVar4;
  _Base_ptr p_Var5;
  Index IVar6;
  size_t sVar7;
  Type *pTVar8;
  size_t sVar9;
  Type type;
  Module *in_RCX;
  ulong uVar10;
  size_t *psVar11;
  Block *block;
  anon_unknown_217 *this_01;
  ulong uVar12;
  Name name;
  Signature SVar13;
  Type local_78;
  Module *local_70;
  HeapType *local_68;
  Function *local_60;
  undefined1 local_58 [8];
  Iterator __begin3;
  char local_31;
  
  poVar1 = this->o;
  psVar11 = &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  local_58 = (undefined1  [8])psVar11;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)local_58,
             (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent);
  if (local_58 != (undefined1  [8])psVar11) {
    operator_delete((void *)local_58,
                    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index + 1);
  }
  this->currFunction = curr;
  (this->lastPrintedLocation).fileIndex = 0;
  (this->lastPrintedLocation).lineNumber = 0;
  (this->lastPrintedLocation).columnNumber = 0;
  if ((curr->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    printDebugLocation(this,(DebugLocation *)
                            ((curr->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left + 1));
  }
  local_58[0] = '(';
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_58,1);
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[31m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"func ",5);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len =
       (size_t)(curr->super_Importable).super_Named.name.super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->super_Importable).super_Named.name.super_IString.str._M_len,
             name,(ostream *)in_RCX);
  if ((this->currModule != (Module *)0x0) && (((this->currModule->features).features & 0x400) != 0))
  {
    std::__ostream_insert<char,std::char_traits<char>>(this->o," (type ",7);
    poVar1 = this->o;
    anon_unknown_217::printHeapType(poVar1,(HeapType)(curr->type).id,this->currModule);
    local_58[0] = ')';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_58,1);
  }
  if (((this->stackIR == false) &&
      ((curr->stackIR)._M_t.
       super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
       .
       super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
       ._M_head_impl != (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0)) &&
     (this->minify == false)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o," (; has Stack IR ;)",0x13);
  }
  this_00 = &curr->type;
  SVar13 = HeapType::getSignature(this_00);
  local_58 = (undefined1  [8])SVar13.params.id;
  sVar7 = wasm::Type::size((Type *)local_58);
  local_68 = this_00;
  local_60 = curr;
  if (sVar7 != 0) {
    SVar13 = HeapType::getSignature(this_00);
    local_78 = SVar13.params.id;
    pTVar8 = &local_78;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])pTVar8;
    local_70 = (Module *)wasm::Type::size(pTVar8);
    in_RCX = (Module *)CONCAT71((int7)((ulong)in_RCX >> 8),local_58 != (undefined1  [8])pTVar8);
    if (((Module *)
         __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         local_70) || (local_58 != (undefined1  [8])pTVar8)) {
      this_01 = (anon_unknown_217 *)0x0;
      do {
        pTVar8 = wasm::Type::Iterator::operator*((Iterator *)local_58);
        poVar1 = this->o;
        pcVar2 = this->maybeSpace;
        if (pcVar2 == (char *)0x0) {
          std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar9);
        }
        local_31 = '(';
        std::__ostream_insert<char,std::char_traits<char>>(this->o,&local_31,1);
        poVar1 = this->o;
        Colors::outputColorCode(poVar1,"\x1b[33m");
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"param ",6);
        Colors::outputColorCode(poVar1,"\x1b[0m");
        anon_unknown_217::printLocal
                  (this_01,(Index)this->currFunction,(Function *)this->o,(ostream *)in_RCX);
        local_31 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(this->o,&local_31,1);
        poVar1 = this->o;
        anon_unknown_217::printType(poVar1,(Type)pTVar8->id,this->currModule);
        local_31 = ')';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_31,1);
        this_01 = (anon_unknown_217 *)(ulong)((int)this_01 + 1);
        in_RCX = (Module *)
                 ((long)&(__begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         )->id + 1);
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)in_RCX;
      } while ((in_RCX != local_70) || (local_58 != (undefined1  [8])&local_78));
    }
  }
  pFVar3 = local_60;
  psVar11 = &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  SVar13 = HeapType::getSignature(local_68);
  if (SVar13.results.id.id != 0) {
    poVar1 = this->o;
    pcVar2 = this->maybeSpace;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar9);
    }
    poVar1 = this->o;
    SVar13 = HeapType::getSignature(local_68);
    in_RCX = this->currModule;
    anon_unknown_217::printPrefixedTypes(poVar1,"result",SVar13.results.id,in_RCX);
  }
  incIndent(this);
  IVar6 = Function::getVarIndexBase(pFVar3);
  uVar12 = (ulong)IVar6;
  sVar7 = Function::getNumLocals(pFVar3);
  if (uVar12 < sVar7) {
    do {
      poVar1 = this->o;
      local_58 = (undefined1  [8])psVar11;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)this->indent);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)local_58,
                 (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent);
      if (local_58 != (undefined1  [8])psVar11) {
        operator_delete((void *)local_58,
                        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index + 1);
      }
      local_58[0] = '(';
      std::__ostream_insert<char,std::char_traits<char>>(this->o,local_58,1);
      poVar1 = this->o;
      Colors::outputColorCode(poVar1,"\x1b[33m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"local ",6);
      Colors::outputColorCode(poVar1,"\x1b[0m");
      pFVar3 = (Function *)this->o;
      anon_unknown_217::printLocal
                ((anon_unknown_217 *)(uVar12 & 0xffffffff),(Index)this->currFunction,pFVar3,
                 (ostream *)in_RCX);
      local_58[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pFVar3,local_58,1);
      poVar1 = this->o;
      type = Function::getLocalType(local_60,(Index)uVar12);
      anon_unknown_217::printType(poVar1,type,this->currModule);
      local_58[0] = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_58,1);
      poVar1 = this->o;
      pcVar2 = this->maybeNewLine;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar9);
      }
      uVar12 = uVar12 + 1;
      sVar7 = Function::getNumLocals(local_60);
    } while (uVar12 < sVar7);
  }
  if ((this->stackIR == false) ||
     (ir = (local_60->stackIR)._M_t.
           super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
           .
           super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
           ._M_head_impl, ir == (StackIR *)0x0)) {
    if ((this->full == false) &&
       ((pEVar4 = local_60->body, pEVar4->_id == BlockId && (pEVar4[1].type.id == 0)))) {
      uVar12 = pEVar4[2].type.id;
      if (uVar12 != 0) {
        uVar10 = 0;
        do {
          if (pEVar4[2].type.id <= uVar10) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          printFullLine(this,*(Expression **)(*(long *)(pEVar4 + 2) + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
    }
    else {
      printFullLine(this,local_60->body);
    }
    if (this->controlFlowDepth != 0) {
      __assert_fail("controlFlowDepth == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                    ,0xc75,"void wasm::PrintSExpression::visitDefinedFunction(Function *)");
    }
  }
  else {
    printStackIR(ir,this->o,local_60);
  }
  if (((this->currFunction->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
     || (((p_Var5 = (this->currFunction->epilogLocation)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left, (this->lastPrintedLocation).fileIndex == p_Var5[1]._M_color
          && ((this->lastPrintedLocation).lineNumber == *(BinaryLocation *)&p_Var5[1].field_0x4)) &&
         ((this->lastPrintedLocation).columnNumber == *(BinaryLocation *)&p_Var5[1]._M_parent)))) {
    decIndent(this);
  }
  else {
    poVar1 = this->o;
    local_58 = (undefined1  [8])psVar11;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)local_58,
               (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent);
    if (local_58 != (undefined1  [8])psVar11) {
      operator_delete((void *)local_58,
                      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index + 1);
    }
    if (this->minify == false) {
      this->indent = this->indent - 1;
    }
    printDebugLocation(this,(DebugLocation *)
                            ((this->currFunction->epilogLocation)._M_t._M_impl.super__Rb_tree_header
                             ._M_header._M_left + 1));
    local_58[0] = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,local_58,1);
  }
  poVar1 = this->o;
  pcVar2 = this->maybeNewLine;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar9 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar9);
  }
  return;
}

Assistant:

void visitDefinedFunction(Function* curr) {
    doIndent(o, indent);
    currFunction = curr;
    lastPrintedLocation = {0, 0, 0};
    if (currFunction->prologLocation.size()) {
      printDebugLocation(*currFunction->prologLocation.begin());
    }
    o << '(';
    printMajor(o, "func ");
    printName(curr->name, o);
    if (currModule && currModule->features.hasGC()) {
      o << " (type ";
      printHeapType(o, curr->type, currModule) << ')';
    }
    if (!stackIR && curr->stackIR && !minify) {
      o << " (; has Stack IR ;)";
    }
    if (curr->getParams().size() > 0) {
      Index i = 0;
      for (const auto& param : curr->getParams()) {
        o << maybeSpace;
        o << '(';
        printMinor(o, "param ");
        printLocal(i, currFunction, o);
        o << ' ';
        printType(o, param, currModule) << ')';
        ++i;
      }
    }
    if (curr->getResults() != Type::none) {
      o << maybeSpace;
      printResultType(o, curr->getResults(), currModule);
    }
    incIndent();
    for (size_t i = curr->getVarIndexBase(); i < curr->getNumLocals(); i++) {
      doIndent(o, indent);
      o << '(';
      printMinor(o, "local ");
      printLocal(i, currFunction, o) << ' ';
      printType(o, curr->getLocalType(i), currModule) << ')';
      o << maybeNewLine;
    }
    // Print the body.
    if (!stackIR || !curr->stackIR) {
      // It is ok to emit a block here, as a function can directly contain a
      // list, even if our ast avoids that for simplicity. We can just do that
      // optimization here..
      if (!full && curr->body->is<Block>() &&
          curr->body->cast<Block>()->name.isNull()) {
        Block* block = curr->body->cast<Block>();
        for (auto item : block->list) {
          printFullLine(item);
        }
      } else {
        printFullLine(curr->body);
      }
      assert(controlFlowDepth == 0);
    } else {
      // Print the stack IR.
      printStackIR(curr->stackIR.get(), o, curr);
    }
    if (currFunction->epilogLocation.size() &&
        lastPrintedLocation != *currFunction->epilogLocation.begin()) {
      // Print last debug location: mix of decIndent and printDebugLocation
      // logic.
      doIndent(o, indent);
      if (!minify) {
        indent--;
      }
      printDebugLocation(*currFunction->epilogLocation.begin());
      o << ')';
    } else {
      decIndent();
    }
    o << maybeNewLine;
  }